

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O0

void __thiscall ScriptOperator_Equals_Test::TestBody(ScriptOperator_Equals_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *in_R9;
  string local_148;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e0;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  Message local_b0;
  string local_a8 [32];
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70;
  ScriptType local_68 [5];
  ScriptType local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  ScriptOperator script_op;
  ScriptOperator_Equals_Test *this_local;
  
  cfd::core::ScriptOperator::ScriptOperator
            ((ScriptOperator *)&gtest_ar.message_,
             (ScriptOperator *)&cfd::core::ScriptOperator::OP_VERIFY);
  local_54 = cfd::core::ScriptOperator::GetDataType((ScriptOperator *)&gtest_ar.message_);
  local_68[0] = kOpVerify;
  testing::internal::EqHelper<false>::Compare<cfd::core::ScriptType,cfd::core::ScriptType>
            ((EqHelper<false> *)local_50,"script_op.GetDataType()","ScriptType::kOpVerify",&local_54
             ,local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  cfd::core::ScriptOperator::ToString_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_88,"script_op.ToString().c_str()","\"OP_VERIFY\"",pcVar3,"OP_VERIFY")
  ;
  std::__cxx11::string::~string(local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  bVar2 = cfd::core::ScriptOperator::Equals((ScriptOperator *)&gtest_ar.message_);
  local_c9 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_c8,
               (AssertionResult *)"script_op.Equals(ScriptOperator::OP_VERIFY)","false","true",in_R9
              );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bVar2 = cfd::core::ScriptOperator::Equals((ScriptOperator *)&gtest_ar.message_);
  local_111 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_148,(internal *)local_110,
               (AssertionResult *)"script_op.Equals(ScriptOperator::OP_RETURN)","true","false",in_R9
              );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  cfd::core::ScriptOperator::~ScriptOperator((ScriptOperator *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ScriptOperator, Equals) {
  ScriptOperator script_op(ScriptOperator::OP_VERIFY);

  EXPECT_EQ(script_op.GetDataType(), ScriptType::kOpVerify);
  EXPECT_STREQ(script_op.ToString().c_str(), "OP_VERIFY");
  EXPECT_TRUE(script_op.Equals(ScriptOperator::OP_VERIFY));
  EXPECT_FALSE(script_op.Equals(ScriptOperator::OP_RETURN));
}